

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcc_compile.cpp
# Opt level: O2

ZCC_Expression * __thiscall ZCCCompiler::SimplifyUnary(ZCCCompiler *this,ZCC_ExprUnary *unary)

{
  ZCC_Expression *pZVar1;
  ZCC_OpProto *pZVar2;
  ZCC_ExprConstant *pZVar3;
  
  pZVar1 = Simplify(this,unary->Operand);
  unary->Operand = pZVar1;
  pZVar2 = PromoteUnary(this,(unary->super_ZCC_Expression).Operation,&unary->Operand);
  if (pZVar2 == (ZCC_OpProto *)0x0) {
    (unary->super_ZCC_Expression).Type = &TypeError->super_PType;
  }
  else {
    pZVar3 = (ZCC_ExprConstant *)unary->Operand;
    if ((pZVar3->super_ZCC_Expression).Operation == PEX_ConstValue) {
      pZVar3 = (*(pZVar2->field_4).EvalConst1)(pZVar3);
      return &pZVar3->super_ZCC_Expression;
    }
  }
  return &unary->super_ZCC_Expression;
}

Assistant:

ZCC_Expression *ZCCCompiler::SimplifyUnary(ZCC_ExprUnary *unary)
{
	unary->Operand = Simplify(unary->Operand);
	ZCC_OpProto *op = PromoteUnary(unary->Operation, unary->Operand);
	if (op == NULL)
	{ // Oh, poo!
		unary->Type = TypeError;
	}
	else if (unary->Operand->Operation == PEX_ConstValue)
	{
		return op->EvalConst1(static_cast<ZCC_ExprConstant *>(unary->Operand));
	}
	return unary;
}